

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductMenu.h
# Opt level: O3

void __thiscall
ProductMenu::ProductMenu
          (ProductMenu *this,string *title,string *subs,int size,
          vector<Product_*,_std::allocator<Product_*>_> *pList)

{
  pointer pcVar1;
  string local_50;
  
  pcVar1 = (title->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + title->_M_string_length);
  Menu::Menu(&this->super_Menu,&local_50,subs,size);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  (this->super_Menu)._vptr_Menu = (_func_int **)&PTR_menuSwitch_00110d58;
  (this->productList).super__Vector_base<Product_*,_std::allocator<Product_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->productList).super__Vector_base<Product_*,_std::allocator<Product_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->productList).super__Vector_base<Product_*,_std::allocator<Product_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->proList = pList;
  std::vector<Product_*,_std::allocator<Product_*>_>::operator=(&this->productList,pList);
  return;
}

Assistant:

ProductMenu(string title, string* subs, int size, vector<Product*> *pList) : Menu(title, subs, size){
        proList = pList;
        productList = *proList;
    }